

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O3

CBNode * __thiscall asmjit::CodeBuilder::addNode(CodeBuilder *this,CBNode *node)

{
  uint uVar1;
  CBNode *pCVar2;
  Error EVar3;
  CBNode *pCVar4;
  CBAlign *node_00;
  undefined4 extraout_var;
  uint32_t alignment;
  uint32_t mode;
  
  if (node == (CBNode *)0x0) {
    addNode();
  }
  else if (node->_prev == (CBNode *)0x0) {
    if (node->_next == (CBNode *)0x0) {
      pCVar4 = this->_cursor;
      if (pCVar4 == (CBNode *)0x0) {
        pCVar4 = this->_firstNode;
        if (pCVar4 == (CBNode *)0x0) {
          this->_firstNode = node;
          pCVar4 = (CBNode *)&this->_lastNode;
        }
        else {
          node->_next = pCVar4;
          pCVar4->_prev = node;
          pCVar4 = (CBNode *)&this->_firstNode;
        }
      }
      else {
        pCVar2 = pCVar4->_next;
        node->_prev = pCVar4;
        node->_next = pCVar2;
        pCVar4->_next = node;
        pCVar4 = (CBNode *)&this->_lastNode;
        if (pCVar2 != (CBNode *)0x0) {
          pCVar4 = pCVar2;
        }
      }
      pCVar4->_prev = node;
      this->_cursor = node;
      return node;
    }
    goto LAB_00112869;
  }
  addNode();
LAB_00112869:
  mode = (uint32_t)node;
  addNode();
  uVar1 = (this->super_CodeEmitter)._lastError;
  pCVar4 = (CBNode *)(ulong)uVar1;
  if (uVar1 == 0) {
    node_00 = newAlignNode(this,mode,alignment);
    if (node_00 == (CBAlign *)0x0) {
      EVar3 = CodeEmitter::setLastError(&this->super_CodeEmitter,1,(char *)0x0);
      return (CBNode *)CONCAT44(extraout_var,EVar3);
    }
    addNode(this,&node_00->super_CBNode);
    pCVar4 = (CBNode *)0x0;
  }
  return pCVar4;
}

Assistant:

CBNode* CodeBuilder::addNode(CBNode* node) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);

  if (!_cursor) {
    if (!_firstNode) {
      _firstNode = node;
      _lastNode = node;
    }
    else {
      node->_next = _firstNode;
      _firstNode->_prev = node;
      _firstNode = node;
    }
  }
  else {
    CBNode* prev = _cursor;
    CBNode* next = _cursor->_next;

    node->_prev = prev;
    node->_next = next;

    prev->_next = node;
    if (next)
      next->_prev = node;
    else
      _lastNode = node;
  }

  _cursor = node;
  return node;
}